

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O2

int64_t mtree_atol8(char **p)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  pcVar1 = *p;
  while( true ) {
    if (7 < (int)*pcVar1 - 0x30U) {
      return lVar2;
    }
    if (0xfffffffffffffff < lVar2) break;
    lVar2 = (ulong)((int)*pcVar1 - 0x30U) + lVar2 * 8;
    *p = pcVar1 + 1;
    pcVar1 = pcVar1 + 1;
  }
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t
mtree_atol8(char **p)
{
	int64_t	l, limit, last_digit_limit;
	int digit, base;

	base = 8;
	limit = INT64_MAX / base;
	last_digit_limit = INT64_MAX % base;

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l>limit || (l == limit && digit > last_digit_limit)) {
			l = INT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (l);
}